

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_addToPath(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t obj;
  char *pcVar2;
  vm_filnam_ext *this_00;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjFileName *in_RDI;
  char *file;
  uint argc;
  int in_stack_000000a4;
  size_t in_stack_000000a8;
  char *in_stack_000000b0;
  size_t in_stack_000000b8;
  char *in_stack_000000c0;
  CVmNativeCodeDesc *in_stack_ffffffffffffff88;
  uint *in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  int local_54;
  
  if (in_RCX == (int *)0x0) {
    local_54 = 0;
  }
  else {
    local_54 = *in_RCX;
  }
  if ((getp_addToPath(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_addToPath(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_addToPath::desc,1);
    __cxa_guard_release(&getp_addToPath(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (iVar1 == 0) {
    CVmStack::get(0);
    pcVar2 = get_local_path(in_stack_ffffffffffffff98);
    if (pcVar2 == (char *)0x0) {
      err_throw(0);
    }
    this_00 = get_ext(in_RDI);
    vm_filnam_ext::get_str(this_00);
    get_ext(in_RDI);
    vm_filnam_ext::get_len((vm_filnam_ext *)0x2e6ca0);
    vmb_get_len((char *)0x2e6cbd);
    obj = combine_path(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                       in_stack_000000a4);
    vm_val_t::set_obj(in_RDX,obj);
    CVmStack::discard(local_54);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_addToPath(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the target path - it can be a FileName or string */
    const char *file = get_local_path(vmg_ G_stk->get(0));
    if (file == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* create a new object from the combined path */
    retval->set_obj(combine_path(
        vmg_ get_ext()->get_str(), get_ext()->get_len(),
        file + VMB_LEN, vmb_get_len(file), FALSE));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}